

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::BufferID,_unsigned_long>,_256UL,_16UL>_>
::unchecked_rehash(table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::BufferID,_unsigned_long>,_256UL,_16UL>_>
                   *this,arrays_type *new_arrays_)

{
  arrays_type *arrays_;
  size_t sVar1;
  size_t sVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  ulong uVar5;
  size_t num_destroyed;
  undefined8 local_40;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::BufferID,_unsigned_long>,_256UL,_16UL>_>
  **local_38;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::BufferID,_void>,_std::equal_to<slang::BufferID>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::BufferID,_unsigned_long>,_256UL,_16UL>_>
  *local_30;
  arrays_type *local_28;
  undefined8 *local_20;
  
  local_20 = &local_40;
  local_40 = 0;
  arrays_ = &this->arrays;
  local_38 = &local_30;
  local_30 = this;
  local_28 = new_arrays_;
  for_all_elements_while<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____external_boost_unordered_hpp:6939:48)>
            (arrays_,(anon_class_8_1_54a39806_conflict9 *)&local_38);
  table_arrays<std::pair<const_slang::BufferID,_unsigned_long>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::BufferID,_unsigned_long>,_256UL,_16UL>_>
  ::delete_((this->
            super_empty_value<slang::detail::hashing::StackAllocator<std::pair<const_slang::BufferID,_unsigned_long>,_256UL,_16UL>,_2U,_false>
            ).value_.storage,arrays_);
  sVar1 = new_arrays_->groups_size_index;
  sVar2 = new_arrays_->groups_size_mask;
  ppVar3 = new_arrays_->elements_;
  (this->arrays).groups_ = new_arrays_->groups_;
  (this->arrays).elements_ = ppVar3;
  arrays_->groups_size_index = sVar1;
  (this->arrays).groups_size_mask = sVar2;
  uVar4 = (this->arrays).groups_size_mask * 0xf + 0xe;
  if ((this->arrays).elements_ == (value_type_pointer)0x0) {
    uVar4 = 0;
  }
  uVar5 = (ulong)((float)uVar4 * 0.875);
  uVar5 = (long)((float)uVar4 * 0.875 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
  if (uVar4 < 0x1e) {
    uVar5 = uVar4;
  }
  (this->size_ctrl).ml = uVar5;
  return;
}

Assistant:

BOOST_NOINLINE void unchecked_rehash(arrays_type& new_arrays_) {
        std::size_t num_destroyed = 0;
        BOOST_TRY {
            for_all_elements([&, this](element_type* p) {
                nosize_transfer_element(p, new_arrays_, num_destroyed);
            });
        }